

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O2

bool doVisit<(arangodb::velocypack::Collection::VisitationOrder)1>
               (Slice slice,
               function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *func)

{
  bool bVar1;
  Slice SVar2;
  Exception *this;
  bool bVar3;
  ObjectPair OVar4;
  ObjectIterator it;
  
  if (arangodb::velocypack::SliceStaticData::TypeMap[*slice._start] == Array) {
    arangodb::velocypack::ArrayIterator::ArrayIterator((ArrayIterator *)&it,slice);
    while (bVar3 = it._position == it._size, !bVar3) {
      SVar2 = arangodb::velocypack::ArrayIterator::value((ArrayIterator *)&it);
      if (((arangodb::velocypack::SliceStaticData::TypeMap[*SVar2._start] & ~Illegal) == Array) &&
         (bVar1 = doVisit<(arangodb::velocypack::Collection::VisitationOrder)1>(SVar2,func), !bVar1)
         ) {
        return bVar3;
      }
      bVar1 = std::function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)>::
              operator()(func,(Slice)0x114f30,SVar2);
      if (!bVar1) {
        return bVar3;
      }
      arangodb::velocypack::ArrayIterator::next((ArrayIterator *)&it);
    }
  }
  else {
    if (arangodb::velocypack::SliceStaticData::TypeMap[*slice._start] != Object) {
      this = (Exception *)__cxa_allocate_exception(0x18);
      arangodb::velocypack::Exception::Exception
                (this,InvalidValueType,"Expecting type Object or Array");
      __cxa_throw(this,&arangodb::velocypack::Exception::typeinfo,
                  arangodb::velocypack::Exception::~Exception);
    }
    arangodb::velocypack::ObjectIterator::ObjectIterator(&it,slice,false);
    while (bVar3 = it._position == it._size, !bVar3) {
      OVar4 = arangodb::velocypack::ObjectIterator::operator*(&it);
      SVar2 = OVar4.value._start;
      if (((arangodb::velocypack::SliceStaticData::TypeMap[*SVar2._start] & ~Illegal) == Array) &&
         (bVar1 = doVisit<(arangodb::velocypack::Collection::VisitationOrder)1>(SVar2,func), !bVar1)
         ) {
        return bVar3;
      }
      bVar1 = std::function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)>::
              operator()(func,OVar4.key._start,SVar2);
      if (!bVar1) {
        return bVar3;
      }
      arangodb::velocypack::ObjectIterator::next(&it);
    }
  }
  return bVar3;
}

Assistant:

static bool doVisit(
    Slice slice,
    std::function<bool(Slice key, Slice value)> const& func) {
  if (slice.isObject()) {
    return visitObject<order>(slice, func);
  }
  if (slice.isArray()) {
    return visitArray<order>(slice, func);
  }

  throw Exception(Exception::InvalidValueType,
                  "Expecting type Object or Array");
}